

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void SetIWork(int m,int n,int panel_size,int *iworkptr,int **segrep,int **parent,int_t **xplore,
             int **repfnz,int **panel_lsub,int_t **xprune,int **marker)

{
  int *piVar1;
  int_t *piVar2;
  int alen;
  
  *segrep = iworkptr;
  piVar1 = iworkptr + m;
  *parent = piVar1;
  piVar1 = piVar1 + m;
  *repfnz = piVar1;
  alen = panel_size * m;
  *panel_lsub = piVar1 + alen;
  *marker = piVar1 + alen + alen;
  ifill(*repfnz,alen,-1);
  ifill(*panel_lsub,alen,-1);
  piVar2 = intMalloc(m);
  *xplore = piVar2;
  piVar2 = intMalloc(n);
  *xprune = piVar2;
  return;
}

Assistant:

void
SetIWork(int m, int n, int panel_size, int *iworkptr, int **segrep,
	 int **parent, int_t **xplore, int **repfnz, int **panel_lsub,
	 int_t **xprune, int **marker)
{
    *segrep = iworkptr;
    *parent = iworkptr + m;
    //    *xplore = *parent + m;
    *repfnz = *parent + m;
    *panel_lsub = *repfnz + panel_size * m;
    //    *xprune = *panel_lsub + panel_size * m;
    // *marker = *xprune + n;
    *marker = *panel_lsub + panel_size * m;
    
    ifill (*repfnz, m * panel_size, SLU_EMPTY);
    ifill (*panel_lsub, m * panel_size, SLU_EMPTY);
    
    *xplore = intMalloc(m); /* can be 64 bit */
    *xprune = intMalloc(n);
}